

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  uLong uVar8;
  short *psVar9;
  void *pvVar10;
  char *fmt;
  long lVar11;
  ulong uVar12;
  long request;
  long request_00;
  bool bVar13;
  long local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar4 = (uint *)a->format->data;
  if (puVar4[0x13ba] == 0xffffffff) {
    puVar4[0x13ba] = 0;
  }
  piVar7 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar7 == (int *)0x0) {
LAB_00413aa3:
    iVar6 = 1;
  }
  else {
    if ((puVar4[0x3c] == 0) &&
       ((((char)*piVar7 == 'M' && (*(char *)((long)piVar7 + 1) == 'Z')) || (*piVar7 == 0x464c457f)))
       ) {
      lVar11 = 0;
      uVar12 = 0x1000;
      do {
        while( true ) {
          if (0x20000 < uVar12 + lVar11) goto LAB_00413b3f;
          pvVar10 = __archive_read_ahead(a,uVar12,&local_38);
          if (pvVar10 == (void *)0x0) break;
          if (local_38 < 0x40) goto LAB_00413b3f;
          request = 0;
          do {
            if (*(int *)((long)pvVar10 + request + 3) == 0x71a21 &&
                *(int *)((long)pvVar10 + request) == 0x21726152) {
              __archive_read_consume(a,request);
              goto LAB_004138ad;
            }
            request_00 = request + 0x10;
            lVar5 = request + 0x17;
            request = request_00;
          } while ((ulong)((long)pvVar10 + lVar5) < (ulong)(local_38 + (long)pvVar10));
          __archive_read_consume(a,request_00);
          lVar11 = lVar11 + request_00;
        }
        bVar13 = 0x7f < uVar12;
        uVar12 = uVar12 >> 1;
      } while (bVar13);
LAB_00413b3f:
      fmt = "Couldn\'t find out RAR header";
LAB_00413b58:
      archive_set_error(&a->archive,0x54,fmt);
    }
    else {
LAB_004138ad:
      puVar4[0x3c] = 1;
      piVar7 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if (piVar7 == (int *)0x0) {
        return -0x1e;
      }
      do {
        cVar1 = *(char *)((long)piVar7 + 2);
        switch(cVar1) {
        case 'r':
          uVar12 = 7;
          if (*(int *)((long)piVar7 + 3) == 0x71a21 && *piVar7 == 0x21726152) goto LAB_00413a78;
          fmt = "Invalid marker header";
          goto LAB_00413b58;
        case 's':
          *puVar4 = (uint)*(ushort *)((long)piVar7 + 3);
          uVar3 = *(ushort *)((long)piVar7 + 5);
          uVar12 = (ulong)uVar3;
          if (uVar3 < 0xd) {
LAB_00413b48:
            fmt = "Invalid header size";
            goto LAB_00413b58;
          }
          psVar9 = (short *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
          if (psVar9 == (short *)0x0) goto LAB_00413b67;
          *(undefined2 *)(puVar4 + 4) = *(undefined2 *)((long)psVar9 + 7);
          *(undefined4 *)((long)puVar4 + 0x12) = *(undefined4 *)((long)psVar9 + 9);
          if ((*puVar4 >> 9 & 1) != 0) {
            if (uVar3 == 0xd) goto LAB_00413b48;
            *(undefined1 *)((long)puVar4 + 0x16) = *(undefined1 *)((long)psVar9 + 0xd);
          }
          if ((char)*puVar4 < '\0') {
            archive_entry_set_is_metadata_encrypted(entry,'\x01');
            archive_entry_set_is_data_encrypted(entry,'\x01');
            puVar4[0x13ba] = 1;
            fmt = "RAR encryption support unavailable.";
            goto LAB_00413b58;
          }
          uVar8 = cm_zlib_crc32(0,(uchar *)(psVar9 + 1),uVar3 - 2);
          if (*psVar9 != (short)uVar8) goto LAB_00413b51;
LAB_00413a78:
          __archive_read_consume(a,uVar12);
          break;
        case 't':
          iVar6 = read_header(a,entry,'t');
          return iVar6;
        case 'u':
        case 'v':
        case 'w':
        case 'x':
        case 'y':
        case '{':
          uVar3 = *(ushort *)((long)piVar7 + 5);
          uVar12 = (ulong)uVar3;
          if (uVar3 < 7) goto LAB_00413b48;
          bVar2 = *(byte *)(piVar7 + 1);
          if (uVar3 == 7) {
            uVar12 = 7;
            if ((short)((ushort)bVar2 << 8) < 0) goto LAB_00413b48;
          }
          else {
            piVar7 = (int *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
            if (piVar7 == (int *)0x0) goto LAB_00413b67;
            if ((short)((ushort)bVar2 << 8) < 0) {
              if (uVar3 < 0xb) goto LAB_00413b48;
              uVar12 = uVar12 + *(uint *)((long)piVar7 + 7);
              piVar7 = (int *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
              if (piVar7 == (int *)0x0) goto LAB_00413b67;
            }
          }
          uVar8 = cm_zlib_crc32(0,(uchar *)((long)piVar7 + 2),(int)uVar12 - 2);
          if ((short)*piVar7 != (short)uVar8) {
LAB_00413b51:
            fmt = "Header CRC error";
            goto LAB_00413b58;
          }
          __archive_read_consume(a,uVar12);
          if (cVar1 == '{') goto LAB_00413aa3;
          break;
        case 'z':
          iVar6 = read_header(a,entry,'z');
          if (iVar6 < -0x14) {
            return iVar6;
          }
          break;
        default:
          fmt = "Bad RAR file";
          goto LAB_00413b58;
        }
        piVar7 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      } while (piVar7 != (int *)0x0);
    }
LAB_00413b67:
    iVar6 = -0x1e;
  }
  return iVar6;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrytped, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if (skip > 7) {
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        skip += archive_le32dec(p + 7);
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      if (head_type == ENDARC_HEAD)
        return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}